

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

Bool Cubic_To(black_PWorker worker,Long cx1,Long cy1,Long cx2,Long cy2,Long x,Long y)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  Long LVar5;
  bool overshoot;
  Bool BVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  TStates aState;
  TPoint *base;
  TPoint *pTVar12;
  TPoint arcs [97];
  
  arcs[3].x = worker->lastX;
  arcs[3].y = worker->lastY;
  arcs[2].x = cx1;
  arcs[2].y = cy1;
  arcs[1].x = cx2;
  arcs[1].y = cy2;
  arcs[0].x = x;
  arcs[0].y = y;
  base = arcs;
  do {
    uVar2 = base[3].y;
    lVar3 = base[2].y;
    uVar4 = base->y;
    uVar9 = uVar4;
    if ((long)uVar4 < (long)uVar2) {
      uVar9 = uVar2;
    }
    lVar8 = base[1].y;
    uVar10 = uVar4;
    if ((long)uVar2 < (long)uVar4) {
      uVar10 = uVar2;
    }
    lVar11 = lVar8;
    if (lVar3 < lVar8) {
      lVar11 = lVar3;
    }
    LVar5 = base->x;
    if (lVar8 < lVar3) {
      lVar8 = lVar3;
    }
    if ((lVar11 < (long)uVar10) || ((long)uVar9 < lVar8)) {
      pTVar12 = base + 3;
      Split_Cubic(base);
    }
    else {
      if (uVar2 != uVar4) {
        aState = ((long)uVar4 < (long)uVar2) + Ascending_State;
        if (worker->state != aState) {
          iVar1 = worker->precision;
          if ((long)uVar4 < (long)uVar2) {
            uVar9 = (long)(iVar1 + -1) & uVar2;
          }
          else {
            uVar9 = ((long)-iVar1 & (uVar2 + (long)iVar1) - 1) - uVar2;
          }
          overshoot = (long)worker->precision_half <= (long)uVar9;
          if ((worker->state != Unknown_State) &&
             (BVar6 = End_Profile(worker,overshoot), BVar6 != '\0')) {
            return '\x01';
          }
          BVar6 = New_Profile(worker,aState,overshoot);
          if (BVar6 != '\0') {
            return '\x01';
          }
        }
        if ((long)uVar4 < (long)uVar2) {
          cVar7 = Bezier_Down(worker,3,base,Split_Cubic,worker->minY,worker->maxY);
        }
        else {
          cVar7 = Bezier_Up(worker,3,base,Split_Cubic,worker->minY,worker->maxY);
        }
        if (cVar7 != '\0') {
          return '\x01';
        }
      }
      pTVar12 = base + -3;
    }
    base = pTVar12;
    if (pTVar12 < arcs) {
      worker->lastX = LVar5;
      worker->lastY = uVar4;
      return '\0';
    }
  } while( true );
}

Assistant:

static Bool
  Cubic_To( RAS_ARGS Long  cx1,
                     Long  cy1,
                     Long  cx2,
                     Long  cy2,
                     Long  x,
                     Long  y )
  {
    Long     y1, y2, y3, y4, x4, ymin1, ymax1, ymin2, ymax2;
    TStates  state_bez;
    TPoint   arcs[3 * MaxBezier + 1]; /* The Bezier stack           */
    TPoint*  arc;                     /* current Bezier arc pointer */


    arc      = arcs;
    arc[3].x = ras.lastX;
    arc[3].y = ras.lastY;
    arc[2].x = cx1;
    arc[2].y = cy1;
    arc[1].x = cx2;
    arc[1].y = cy2;
    arc[0].x = x;
    arc[0].y = y;

    do
    {
      y1 = arc[3].y;
      y2 = arc[2].y;
      y3 = arc[1].y;
      y4 = arc[0].y;
      x4 = arc[0].x;

      /* first, categorize the Bezier arc */

      if ( y1 <= y4 )
      {
        ymin1 = y1;
        ymax1 = y4;
      }
      else
      {
        ymin1 = y4;
        ymax1 = y1;
      }

      if ( y2 <= y3 )
      {
        ymin2 = y2;
        ymax2 = y3;
      }
      else
      {
        ymin2 = y3;
        ymax2 = y2;
      }

      if ( ymin2 < ymin1 || ymax2 > ymax1 )
      {
        /* this arc has no given direction, split it! */
        Split_Cubic( arc );
        arc += 3;
      }
      else if ( y1 == y4 )
      {
        /* this arc is flat, ignore it and pop it from the Bezier stack */
        arc -= 3;
      }
      else
      {
        state_bez = ( y1 <= y4 ) ? Ascending_State : Descending_State;

        /* detect a change of direction */
        if ( ras.state != state_bez )
        {
          Bool  o = ( state_bez == Ascending_State )
                      ? IS_BOTTOM_OVERSHOOT( y1 )
                      : IS_TOP_OVERSHOOT( y1 );


          /* finalize current profile if any */
          if ( ras.state != Unknown_State &&
               End_Profile( RAS_VARS o )  )
            goto Fail;

          if ( New_Profile( RAS_VARS state_bez, o ) )
            goto Fail;
        }

        /* compute intersections */
        if ( state_bez == Ascending_State )
        {
          if ( Bezier_Up( RAS_VARS 3, arc, Split_Cubic,
                                   ras.minY, ras.maxY ) )
            goto Fail;
        }
        else
          if ( Bezier_Down( RAS_VARS 3, arc, Split_Cubic,
                                     ras.minY, ras.maxY ) )
            goto Fail;
        arc -= 3;
      }

    } while ( arc >= arcs );

    ras.lastX = x4;
    ras.lastY = y4;

    return SUCCESS;

  Fail:
    return FAILURE;
  }